

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiener.cxx
# Opt level: O2

void __thiscall Wiener::Wiener(Wiener *this,Time *time,string *name,string *type)

{
  double dVar1;
  allocator<char> local_41;
  string local_40;
  
  RandN::RandN(&this->super_RandN);
  StochasticVariable::StochasticVariable((StochasticVariable *)this,time,name,type);
  *(undefined ***)this = &PTR__Wiener_001577b0;
  *(undefined ***)&this->field_0x60 = &PTR__Wiener_00157870;
  *(undefined ***)&this->field_0x78 = &PTR__Wiener_001578b8;
  *(undefined4 *)&this->wienerMean = 0;
  *(undefined4 *)((long)&this->wienerMean + 4) = 0;
  *(undefined4 *)&this->wienerStdDev = 0;
  *(undefined4 *)((long)&this->wienerStdDev + 4) = 0x3ff00000;
  dVar1 = *(double *)(*(long *)&this->field_0x70 + 200);
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  this->wienerSqrtDt = dVar1;
  std::__cxx11::string::assign(&this->field_0x128);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"mean",&local_41);
  Parametric::addParameter((Parametric *)this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"variance",&local_41);
  Parametric::addParameter((Parametric *)this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  (**(code **)(*(long *)this + 0x68))(this);
  return;
}

Assistant:

Wiener::Wiener(Time *time, const string& name, const string& type)
	: StochasticVariable( time, name, type )
{
	wienerMean = 0.0;
	wienerStdDev = 1.0;
	wienerSqrtDt = sqrt(xTime->dt);
	stochDescription = "Wiener process";
	addParameter("mean");
	addParameter("variance");
	init();
}